

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

int decode_hex(int ch)

{
  undefined4 local_c;
  int ch_local;
  
  if ((ch < 0x30) || (0x39 < ch)) {
    if ((ch < 0x41) || (0x46 < ch)) {
      if ((ch < 0x61) || (0x66 < ch)) {
        local_c = -1;
      }
      else {
        local_c = ch + -0x57;
      }
    }
    else {
      local_c = ch + -0x37;
    }
  }
  else {
    local_c = ch + -0x30;
  }
  return local_c;
}

Assistant:

static int decode_hex(int ch)
{
    if ('0' <= ch && ch <= '9') {
        return ch - '0';
    } else if ('A' <= ch && ch <= 'F') {
        return ch - 'A' + 0xa;
    } else if ('a' <= ch && ch <= 'f') {
        return ch - 'a' + 0xa;
    } else {
        return -1;
    }
}